

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void jsonnet::internal::fodder_push_back(Fodder *a,FodderElement *elem)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  int *in_RSI;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__args_3;
  value_type *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffbc;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffc0;
  value_type local_38;
  int *local_10;
  
  local_10 = in_RSI;
  bVar1 = fodder_has_clean_endline(in_stack_ffffffffffffffa0);
  if ((bVar1) && (*local_10 == 0)) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 4));
    if (sVar2 == 0) {
      uVar4 = local_10[2];
      pvVar3 = std::
               vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ::back(in_stack_ffffffffffffffa0);
      pvVar3->indent = uVar4;
      iVar5 = local_10[1];
      pvVar3 = std::
               vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               ::back(in_stack_ffffffffffffffa0);
      pvVar3->blanks = iVar5 + pvVar3->blanks;
    }
    else {
      local_38.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
      std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
      ::
      emplace_back<jsonnet::internal::FodderElement::Kind,unsigned_int_const&,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                (in_stack_ffffffffffffffc0,
                 (Kind *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (uint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 &in_stack_ffffffffffffffa8->kind,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffa0);
    }
  }
  else {
    bVar1 = fodder_has_clean_endline(in_stack_ffffffffffffffa0);
    if ((!bVar1) && (*local_10 == 2)) {
      local_38.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_38.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      __args_3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_10 + 2);
      local_38.kind = LINE_END;
      local_38.blanks = 0;
      local_38.indent = 0;
      local_38._12_4_ = 0;
      local_38.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      in_stack_ffffffffffffffa8 = &local_38;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2d2810);
      std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
      ::
      emplace_back<jsonnet::internal::FodderElement::Kind,int,unsigned_int_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_ffffffffffffffc0,
                 (Kind *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 &in_stack_ffffffffffffffa8->kind,__args_3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::push_back((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

static inline void fodder_push_back(Fodder &a, const FodderElement &elem)
{
    if (fodder_has_clean_endline(a) && elem.kind == FodderElement::LINE_END) {
        if (elem.comment.size() > 0) {
            // The line end had a comment, so create a single line paragraph for it.
            a.emplace_back(FodderElement::PARAGRAPH, elem.blanks, elem.indent, elem.comment);
        } else {
            // Merge it into the previous line end.
            a.back().indent = elem.indent;
            a.back().blanks += elem.blanks;
        }
    } else {
        if (!fodder_has_clean_endline(a) && elem.kind == FodderElement::PARAGRAPH) {
            a.emplace_back(FodderElement::LINE_END, 0, elem.indent, std::vector<std::string>());
        }
        a.push_back(elem);
    }
}